

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfftpack.c
# Opt level: O3

int dst_forward(fft_t *f,double *data)

{
  int *n;
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  int ier;
  double local_20;
  
  ier = -1;
  if (data != (double *)0x0 && f != (fft_t *)0x0) {
    ier = 0;
    if (f->ortho != 0) {
      dVar3 = 1.0 / (double)f->n;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar4 = 0.5 / (double)f->n;
      if (dVar4 < 0.0) {
        local_20 = dVar3;
        dVar4 = sqrt(dVar4);
        dVar3 = local_20;
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      *data = dVar3 * *data;
      iVar1 = f->n;
      if (1 < (long)iVar1) {
        lVar2 = 1;
        do {
          data[lVar2] = data[lVar2] * dVar4;
          lVar2 = lVar2 + 1;
        } while (iVar1 != lVar2);
      }
    }
    n = &f->n;
    sinq1f_(n,&f->inc,data,n,f->save,&f->lensav,f->work,&f->lenwork,&ier);
    if (f->ortho != 0) {
      iVar1 = *n;
      if (0 < (long)iVar1) {
        lVar2 = 0;
        do {
          data[lVar2] = data[lVar2] * (double)iVar1;
          lVar2 = lVar2 + 1;
        } while (iVar1 != lVar2);
      }
    }
  }
  return ier;
}

Assistant:

int dst_forward(fft_t *f, fft_real_t *data){
  if (!f || !data)
    return -1;
  int ier=0;
  if (f->ortho){
    fft_real_t m0,m;
    m0 = sqrt(1.0/f->n);
    m  = sqrt(0.5/f->n);
    data[0]*=m0;
    int n;
    for (n=1; n<f->n; n++)
      data[n] *= m;
  }
  sinq1f_(&f->n, &f->inc, data, &f->n, f->save, &f->lensav, f->work, &f->lenwork, &ier);
  if (f->ortho){
    fft_real_t m = f->n;
    int n;
    for (n=0; n<f->n; n++)
      data[n] *= m;
  }
  if (ier)
    return ier;
  return 0;
}